

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.cpp
# Opt level: O2

ScoreMap *
InferExamAnswers::Algorithm::computeScoreMap
          (ScoreMap *__return_storage_ptr__,ExamResults *examResults,uint8_t n,uint8_t m)

{
  long *plVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  unsigned_long *puVar5;
  uchar *puVar6;
  mapped_type *pmVar7;
  uchar *__s;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  __node_type *__n;
  size_type __bkt_count_hint;
  uint uVar11;
  pair<std::__detail::_Node_iterator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_false,_true>,_bool>
  pVar12;
  allocator_type local_8a;
  key_equal local_89;
  __hashtable *__h;
  _Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
  local_80;
  valarray<unsigned_char> score;
  
  uVar2 = examResults->questionCount;
  __bkt_count_hint = 1L << (m - n & 0x3f);
  std::
  _Hashtable<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h,__bkt_count_hint,(ScoreValarrayHash *)&score,&local_89,
               &local_8a);
  if ((uint8_t)(m - n) == '\0') {
    uVar10 = (ulong)examResults->studentCount;
    score._M_size = uVar10;
    score._M_data = (uchar *)operator_new(uVar10);
    memset(score._M_data,0,uVar10);
    pmVar7 = std::__detail::
             _Map_base<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)__return_storage_ptr__,&score);
    pmVar7->solution = 0;
    pmVar7->size = 1;
    operator_delete(score._M_data);
  }
  else {
    uVar11 = 0;
    __h = &__return_storage_ptr__->_M_h;
    for (; __return_storage_ptr__ = (ScoreMap *)__h, uVar11 < __bkt_count_hint; uVar11 = uVar11 + 1)
    {
      __n = (__node_type *)(ulong)examResults->studentCount;
      __s = (uchar *)operator_new((ulong)__n);
      local_80._M_cur = __n;
      memset(__s,0,(size_t)__n);
      bVar3 = examResults->studentCount;
      puVar5 = (examResults->answers)._M_data;
      puVar6 = (examResults->scores)._M_data;
      uVar10 = 0;
      while (bVar3 != uVar10) {
        uVar9 = ~(uVar11 ^ (uint)(puVar5[uVar10] >> (n & 0x3f))) & (int)__bkt_count_hint - 1U;
        uVar9 = uVar9 - (uVar9 >> 1 & 0x55555555);
        uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333);
        uVar9 = ((uVar9 >> 4) + uVar9 & 0xf0f0f0f) * 0x1010101;
        bVar8 = (byte)(uVar9 >> 0x18);
        __s[uVar10] = bVar8;
        bVar4 = puVar6[uVar10];
        if (((uVar9 >> 0x18) + (uint)(byte)(uVar2 - (m - n)) < (uint)bVar4) ||
           (uVar10 = uVar10 + 1, bVar4 < bVar8)) goto LAB_00112635;
      }
      score._M_size = (size_t)local_80._M_cur;
      score._M_data = __s;
      pVar12 = std::
               _Hashtable<std::valarray<unsigned_char>,std::pair<std::valarray<unsigned_char>const,InferExamAnswers::SolutionCollection>,std::allocator<std::pair<std::valarray<unsigned_char>const,InferExamAnswers::SolutionCollection>>,std::__detail::_Select1st,InferExamAnswers::ScoreValarrayEqual,InferExamAnswers::ScoreValarrayHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::
               _M_emplace<std::pair<std::valarray<unsigned_char>const,InferExamAnswers::SolutionCollection>>
                         ((_Hashtable<std::valarray<unsigned_char>,std::pair<std::valarray<unsigned_char>const,InferExamAnswers::SolutionCollection>,std::allocator<std::pair<std::valarray<unsigned_char>const,InferExamAnswers::SolutionCollection>>,std::__detail::_Select1st,InferExamAnswers::ScoreValarrayEqual,InferExamAnswers::ScoreValarrayHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           *)__h);
      local_80._M_cur =
           (__node_type *)
           pVar12.first.
           super__Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
           ._M_cur;
      operator_delete(score._M_data);
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        plVar1 = (long *)((long)&((local_80._M_cur)->
                                 super__Hash_node_value<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>
                                 ._M_storage._M_storage + 0x20);
        *plVar1 = *plVar1 + 1;
      }
      __s = (uchar *)0x0;
LAB_00112635:
      operator_delete(__s);
    }
    std::
    _Hashtable<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::rehash(__h,__h->_M_element_count);
  }
  return (ScoreMap *)&__return_storage_ptr__->_M_h;
}

Assistant:

Algorithm::ScoreMap Algorithm::computeScoreMap(const ExamResults& examResults, const uint8_t n, const uint8_t m)
{
	/**
	 *  Compute the length of the answers to create for the current partition
	 *  and the also compute the length of the anwers for the other partition.
	 */
	const uint8_t currentSequenceLength = m - n;
	const uint8_t otherSequenceLength = examResults.questionCount - currentSequenceLength;

	/**
	 * We have to check 2^currentSequenceLength solutions.
	 * So we create that number so we can use it as the upper
	 * limit in a for loop.
	 */
	const uint64_t solutionsToCheck = 1UL << currentSequenceLength;

	/**
	 * Since we are checking a subset of the total answers
	 * of a student we might have some extra bits from other
	 * answers we need to disregard. This mask uses can be used
	 * to filter out only the bits of the current subset since
	 * it contains currentSequenceLength number of 1 bits
	 */
	const uint64_t scoreMask = solutionsToCheck - 1UL;

	/**
	 * Initial bucket count will be the amount of possible solutions so a rehash
	 * will never occur while trying solutions.
	 */
	ScoreMap scoreMap(solutionsToCheck);

	/**
	 * If the length of the current partition is 0 no solution would be checked.
	 * However there still is a correct in that case. One with 0 solutions
	 */
	if (currentSequenceLength == 0) {
		std::valarray<uint8_t> score(examResults.studentCount);

		auto collection = SolutionCollection();
		collection.addSolution(0);
		scoreMap[std::move(score)] = std::move(collection);
		return scoreMap;
	}

	/**
	 * We create every possible solution from 0 to 2^n
	 * Verify if the resulting score with that solution
	 * still makes it possible to obtain the actual score
	 * the student got.
	 */
	for (uint32_t i = 0; i < solutionsToCheck; ++i) {
		auto keepSolution = true;
		std::valarray<uint8_t> score(examResults.studentCount);

		for (uint8_t j = 0; j < examResults.studentCount; ++j) {
			/**
			 * To obtain the score a student has obtained given a solution and the answer
			 * We first have to bitshift the solution over the current answers we are going
			 * to check. Then we apply a XOR operation. This results in a bit string that
			 * will contain a 1 if the answer didn't match and a 0 if it did match. So we
			 * negate that result. However since this result can still contain answers
			 * from the partition that we are currently disregarding we have to mask them
			 * out using the scoreMask.
			 *
			 * Now finally we need to count the amount of set bits in the resulting bit string.
			 * For this we use the special builtin function popcount which actually results
			 * in a single assembly instruction on modern hardware.
			 */
			const uint64_t correctAnswers = ~((examResults.answers[j] >> n) ^ i) & scoreMask;
			score[j] = __builtin_popcount(correctAnswers);

			/**
			 * The solution will be thrown away if the current
			 * score plus the perfect score for the other partition
			 * is smaller then the required score because there is no way
			 * to obtain the required score then.
			 * The same applies if the score exceeds the required score.
			 */
			if (score[j] + otherSequenceLength < examResults.scores[j] || score[j] > examResults.scores[j]) {
				keepSolution = false;
				break;
			}
		}

		if (!keepSolution) {
			continue;
		}

		SolutionCollection collection;
		collection.addSolution(i);

		// Clang-tidy sees this as a dead store but it's a false positive
		auto [it, inserted] = scoreMap.insert({std::move(score), std::move(collection)}); // NOLINT
		if (!inserted) {
			it->second.grow(1);
		}
	}

	/**
	 * Rehashing will remove unused buckets. Since after this the map will not
	 * be mutated further this will improve iteration speed when combining the
	 * partitions
	 */
	scoreMap.rehash(scoreMap.size());

	return scoreMap;
}